

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_image_t * j2k_decode(opj_j2k_t *j2k,opj_cio_t *cio,opj_codestream_info_t *cstr_info)

{
  uint id_00;
  int iVar1;
  opj_image_t *poVar2;
  opj_dec_mstabent_t *poVar3;
  opj_codestream_info_t *in_RDX;
  opj_cio_t *in_RSI;
  opj_j2k_t *in_RDI;
  int id;
  opj_dec_mstabent_t *e;
  opj_common_ptr cinfo;
  opj_image_t *image;
  int in_stack_ffffffffffffffac;
  opj_cio_t *in_stack_ffffffffffffffb0;
  opj_common_ptr cinfo_00;
  undefined4 in_stack_ffffffffffffffc0;
  
  cinfo_00 = in_RDI->cinfo;
  in_RDI->cio = in_RSI;
  in_RDI->cstr_info = in_RDX;
  if (in_RDX != (opj_codestream_info_t *)0x0) {
    memset(in_RDX,0,0x70);
  }
  poVar2 = opj_image_create0();
  in_RDI->image = poVar2;
  in_RDI->state = 1;
  while( true ) {
    id_00 = cio_read(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if ((int)id_00 >> 8 != 0xff) {
      opj_image_destroy((opj_image_t *)in_stack_ffffffffffffffb0);
      iVar1 = cio_tell(in_RSI);
      opj_event_msg(cinfo_00,1,"%.8x: expected a marker instead of %x\n",(ulong)(iVar1 - 2),
                    (ulong)id_00);
      return (opj_image_t *)0x0;
    }
    poVar3 = j2k_dec_mstab_lookup(id_00);
    if ((in_RDI->state & poVar3->states) == 0) {
      opj_image_destroy((opj_image_t *)in_stack_ffffffffffffffb0);
      iVar1 = cio_tell(in_RSI);
      opj_event_msg(cinfo_00,1,"%.8x: unexpected marker %x\n",(ulong)(iVar1 - 2),(ulong)id_00);
      return (opj_image_t *)0x0;
    }
    if ((poVar3->id == 0xff90) && (in_RDI->cp->limit_decoding == LIMIT_TO_MAIN_HEADER)) {
      opj_event_msg(cinfo_00,4,"Main Header decoded.\n");
      return poVar2;
    }
    if (poVar3->handler != (_func_void_opj_j2k_t_ptr *)0x0) {
      (*poVar3->handler)(in_RDI);
    }
    if ((in_RDI->state & 0x8000U) != 0) break;
    if ((in_RDI->state == 0x20) || (in_RDI->state == 0x40)) {
      if (in_RDI->state == 0x40) {
        j2k_read_eoc((opj_j2k_t *)CONCAT44(id_00,in_stack_ffffffffffffffc0));
      }
      if (in_RDI->state != 0x20) {
        opj_event_msg(cinfo_00,2,"Incomplete bitstream\n");
      }
      return poVar2;
    }
  }
  return (opj_image_t *)0x0;
}

Assistant:

opj_image_t* j2k_decode(opj_j2k_t *j2k, opj_cio_t *cio, opj_codestream_info_t *cstr_info) {
	opj_image_t *image = NULL;

	opj_common_ptr cinfo = j2k->cinfo;	

	j2k->cio = cio;
	j2k->cstr_info = cstr_info;
	if (cstr_info)
		memset(cstr_info, 0, sizeof(opj_codestream_info_t));

	/* create an empty image */
	image = opj_image_create0();
	j2k->image = image;

	j2k->state = J2K_STATE_MHSOC;

	for (;;) {
		opj_dec_mstabent_t *e;
		int id = cio_read(cio, 2);

#ifdef USE_JPWL
		/* we try to honor JPWL correction power */
		if (j2k->cp->correct) {

			int orig_pos = cio_tell(cio);
			opj_bool status;

			/* call the corrector */
			status = jpwl_correct(j2k);

			/* go back to where you were */
			cio_seek(cio, orig_pos - 2);

			/* re-read the marker */
			id = cio_read(cio, 2);

			/* check whether it begins with ff */
			if (id >> 8 != 0xff) {
				opj_event_msg(cinfo, EVT_ERROR,
					"JPWL: possible bad marker %x at %d\n",
					id, cio_tell(cio) - 2);
				if (!JPWL_ASSUME) {
					opj_image_destroy(image);
					opj_event_msg(cinfo, EVT_ERROR, "JPWL: giving up\n");
					return 0;
				}
				/* we try to correct */
				id = id | 0xff00;
				cio_seek(cio, cio_tell(cio) - 2);
				cio_write(cio, id, 2);
				opj_event_msg(cinfo, EVT_WARNING, "- trying to adjust this\n"
					"- setting marker to %x\n",
					id);
			}

		}
#endif /* USE_JPWL */

		if (id >> 8 != 0xff) {
			opj_image_destroy(image);
			opj_event_msg(cinfo, EVT_ERROR, "%.8x: expected a marker instead of %x\n", cio_tell(cio) - 2, id);
			return 0;
		}
		e = j2k_dec_mstab_lookup(id);
		/* Check if the marker is known*/
		if (!(j2k->state & e->states)) {
			opj_image_destroy(image);
			opj_event_msg(cinfo, EVT_ERROR, "%.8x: unexpected marker %x\n", cio_tell(cio) - 2, id);
			return 0;
		}
		/* Check if the decoding is limited to the main header*/
		if (e->id == J2K_MS_SOT && j2k->cp->limit_decoding == LIMIT_TO_MAIN_HEADER) {
			opj_event_msg(cinfo, EVT_INFO, "Main Header decoded.\n");
			return image;
		}		

		if (e->handler) {
			(*e->handler)(j2k);
		}
		if (j2k->state & J2K_STATE_ERR) 
			return NULL;	

		if (j2k->state == J2K_STATE_MT) {
			break;
		}
		if (j2k->state == J2K_STATE_NEOC) {
			break;
		}
	}
	if (j2k->state == J2K_STATE_NEOC) {
		j2k_read_eoc(j2k);
	}

	if (j2k->state != J2K_STATE_MT) {
		opj_event_msg(cinfo, EVT_WARNING, "Incomplete bitstream\n");
	}
	return image;
}